

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_code.cc
# Opt level: O3

void re2c::from_le(OutputFile *o,uint32_t ind,size_t size,char *expr)

{
  OutputFile *pOVar1;
  uint32_t n;
  undefined4 in_register_00000034;
  ulong uVar2;
  
  pOVar1 = OutputFile::ws(o,"\n");
  pOVar1 = OutputFile::wind(pOVar1,2);
  OutputFile::ws(pOVar1,"/* from little-endian to host-endian */");
  pOVar1 = OutputFile::ws(o,"\n");
  pOVar1 = OutputFile::wind(pOVar1,2);
  pOVar1 = OutputFile::ws(pOVar1,"unsigned char *p = (unsigned char*)&");
  pOVar1 = OutputFile::ws(pOVar1,(char *)size);
  OutputFile::ws(pOVar1,";");
  pOVar1 = OutputFile::ws(o,"\n");
  pOVar1 = OutputFile::wind(pOVar1,2);
  pOVar1 = OutputFile::ws(pOVar1,(char *)size);
  OutputFile::ws(pOVar1," = p[0]");
  if (1 < CONCAT44(in_register_00000034,ind)) {
    uVar2 = 1;
    n = 8;
    do {
      pOVar1 = OutputFile::ws(o," + (p[");
      pOVar1 = OutputFile::wu32(pOVar1,(uint32_t)uVar2);
      pOVar1 = OutputFile::ws(pOVar1,"] << ");
      pOVar1 = OutputFile::wu32(pOVar1,n);
      OutputFile::ws(pOVar1,"u)");
      uVar2 = (ulong)((uint32_t)uVar2 + 1);
      n = n + 8;
    } while (uVar2 < CONCAT44(in_register_00000034,ind));
  }
  OutputFile::ws(o,";");
  return;
}

Assistant:

static void from_le(OutputFile &o, uint32_t ind, size_t size, const char *expr)
{
	o.ws("\n").wind(ind).ws("/* from little-endian to host-endian */");
	o.ws("\n").wind(ind).ws("unsigned char *p = (unsigned char*)&").ws(expr).ws(";");
	o.ws("\n").wind(ind).ws(expr).ws(" = p[0]");
	for (uint32_t i = 1; i < size; ++i)
	{
		o.ws(" + (p[").wu32(i).ws("] << ").wu32(i * 8).ws("u)");
	}
	o.ws(";");
}